

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int CVmObjFile::sfid_to_path(char *buf,size_t buflen,int32_t sfid)

{
  char *filename;
  char path [4096];
  
  if (sfid == 1) {
    filename = "settings.txt";
  }
  else {
    if (sfid != 2) {
      *buf = '\0';
      return 0;
    }
    filename = "webprefs.txt";
  }
  (*G_host_ifc_X->_vptr_CVmHostIfc[0x12])(G_host_ifc_X,path,0x1000,5);
  os_build_full_path(buf,buflen,path,filename);
  return 1;
}

Assistant:

int CVmObjFile::sfid_to_path(VMG_ char *buf, size_t buflen, int32_t sfid)
{
    const char *fname = 0;
    char path[OSFNMAX];
    switch (sfid)
    {
    case SFID_LIB_DEFAULTS:
        /* library defaults file - T3_APP_DATA/settings.txt */
        fname = "settings.txt";
        goto app_data_file;
        
    case SFID_WEBUI_PREFS:
        /* Web UI preferences - T3_APP_DATA/webprefs.txt */
        fname = "webprefs.txt";
        goto app_data_file;
        
    app_data_file:
        /* get the system application data path */
        G_host_ifc->get_special_file_path(
            path, sizeof(path), OS_GSP_T3_APP_DATA);
        
        /* add the filename */
        os_build_full_path(buf, buflen, path, fname);
        
        /* success */
        return TRUE;
        
    default:
        /* invalid ID value */
        buf[0] = '\0';
        return FALSE;
    }
}